

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialMotionVector.cpp
# Opt level: O3

SpatialMotionVector * __thiscall
iDynTree::SpatialMotionVector::cross
          (SpatialMotionVector *__return_storage_ptr__,SpatialMotionVector *this,
          SpatialMotionVector *other)

{
  AngularVector3T *this_00;
  AngularVector3T *other_00;
  GeomVector3 local_60;
  GeomVector3 local_48;
  
  this_00 = &(this->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3;
  GeomVector3::cross(this_00,(GeomVector3 *)other);
  other_00 = &(other->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3;
  GeomVector3::cross((GeomVector3 *)this,other_00);
  GeomVector3::operator+(&local_60,&local_48);
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.
  super_Vector3.m_data[0] = 0.0;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.
  super_Vector3.m_data[1] = 0.0;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.
  super_Vector3.m_data[2] = 0.0;
  GeomVector3::cross(this_00,other_00);
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.
  super_Vector3.m_data[2] = local_60.super_Vector3.m_data[2];
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.
  super_Vector3.m_data[0] = local_60.super_Vector3.m_data[0];
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.
  super_Vector3.m_data[1] = local_60.super_Vector3.m_data[1];
  return __return_storage_ptr__;
}

Assistant:

SpatialMotionVector SpatialMotionVector::cross(const SpatialMotionVector& other) const
{
    SpatialMotionVector res;

    res.getLinearVec3()  = this->angularVec3.cross(other.getLinearVec3()) + this->linearVec3.cross(other.getAngularVec3());
    res.getAngularVec3() =                                                  this->angularVec3.cross(other.getAngularVec3());

    return res;
}